

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapimages.cpp
# Opt level: O0

CTextureHandle __thiscall CMapImages::GetEasterTexture(CMapImages *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  IGraphics *pIVar4;
  IConsole *pIVar5;
  long in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(in_RDI + 0x21c) & 1) == 0) {
    pIVar4 = CComponent::Graphics((CComponent *)0x16eb3c);
    iVar3 = (*(pIVar4->super_IInterface)._vptr_IInterface[0x12])
                      (pIVar4,"mapres/easter.png",0xffffffff,0xffffffff,4);
    *(int *)(in_RDI + 0x218) = iVar3;
    bVar2 = IGraphics::CTextureHandle::IsValid((CTextureHandle *)0x16eb7b);
    if (!bVar2) {
      pIVar5 = CComponent::Console((CComponent *)0x16eb89);
      (*(pIVar5->super_IInterface)._vptr_IInterface[0x19])
                (pIVar5,1,"mapimages","Failed to load easter.png",0);
    }
    *(undefined1 *)(in_RDI + 0x21c) = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (CTextureHandle)*(int *)(in_RDI + 0x218);
  }
  __stack_chk_fail();
}

Assistant:

IGraphics::CTextureHandle CMapImages::GetEasterTexture()
{
	if(!m_EasterIsLoaded)
	{
		m_EasterTexture = Graphics()->LoadTexture("mapres/easter.png", IStorage::TYPE_ALL, CImageInfo::FORMAT_AUTO, IGraphics::TEXLOAD_ARRAY_256);
		if(!m_EasterTexture.IsValid())
			Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "mapimages", "Failed to load easter.png");
		m_EasterIsLoaded = true;
	}
	return m_EasterTexture;
}